

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O1

void decode_nvrm_ioctl_vspace_map(nvrm_ioctl_vspace_map *s)

{
  char *pcVar1;
  FILE *__stream;
  
  fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%shandle: 0x%08x",nvrm_sep,(ulong)s->handle);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->handle,"handle");
  fprintf(_stdout,"%sdev: 0x%08x",nvrm_pfx,(ulong)s->dev);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->dev,"dev");
  fprintf(_stdout,"%svspace: 0x%08x",nvrm_pfx,(ulong)s->vspace);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->vspace,"vspace");
  fprintf(_stdout,"%sbase: 0x%016lx",nvrm_pfx,s->base);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%ssize: 0x%016lx",nvrm_sep,s->size);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sflags: 0x%08x",nvrm_sep,(ulong)s->flags);
  nvrm_pfx = nvrm_sep;
  if (s->_pad1 != 0) {
    fprintf(_stdout,"%s%s_pad1: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad1,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%saddr: 0x%016lx",nvrm_sep,s->addr);
  __stream = _stdout;
  pcVar1 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  nvrm_status(s->status);
  fprintf(__stream,"%sstatus: %s",pcVar1,nvrm_status::buf);
  nvrm_pfx = nvrm_sep;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad2,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_vspace_map(struct nvrm_ioctl_vspace_map *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, dev, cid);
	nvrm_print_handle(s, vspace, cid);
	nvrm_print_x64(s, base);
	nvrm_print_x64(s, size);
	nvrm_print_x32(s, flags);
	nvrm_print_pad_x32(s, _pad1);
	nvrm_print_x64(s, addr);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_ln();
}